

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::rp_hsol_da_str(HDual *this)

{
  int *piVar1;
  uint *puVar2;
  reference pvVar3;
  long in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  uint local_c;
  
  printf("\nIteration %d\n",(ulong)*(uint *)(*(long *)(in_RDI + 0x60) + 0x588));
  if (*(int *)(in_RDI + 0x80) < 0x15) {
    printf("\nData structures\n");
    printf("         ");
    for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x80); local_c = local_c + 1) {
      printf(" %4d",(ulong)local_c);
    }
    printf("\n");
    printf("NonBcFg: ");
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x80); local_10 = local_10 + 1) {
      piVar1 = HModel::getNonbasicFlag((HModel *)0x14b0d0);
      printf(" %4d",(ulong)(uint)piVar1[local_10]);
    }
    printf("\n");
    printf("WorkMv:  ");
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x80); local_14 = local_14 + 1) {
      piVar1 = HModel::getNonbasicMove((HModel *)0x14b134);
      printf(" %4d",(ulong)(uint)piVar1[local_14]);
    }
    printf("\n");
    printf("DvxIx:   ");
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x80); local_18 = local_18 + 1) {
      puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),
                                  (long)local_18);
      printf(" %4d",(ulong)*puVar2);
    }
    printf("\n");
    printf("BcIx:    ");
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x7c); local_1c = local_1c + 1) {
      piVar1 = HModel::getBaseIndex((HModel *)0x14b1f8);
      printf(" %4d",(ulong)(uint)piVar1[local_1c]);
    }
    printf("\n");
    printf("DvxV:    ");
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x7c); local_20 = local_20 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x660),(long)local_20
                         );
      printf(" %4.1g",*pvVar3);
    }
    printf("\n");
  }
  return;
}

Assistant:

void HDual::rp_hsol_da_str() {

	printf("\nIteration %d\n", model->numberIteration);
	if (numTot > mx_rp_numTot)
		return;

	printf("\nData structures\n");
	printf("         ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", i);
	}
	printf("\n");

	printf("NonBcFg: ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", model->getNonbasicFlag()[i]);
	}
	printf("\n");

	printf("WorkMv:  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", model->getNonbasicMove()[i]);
	}
	printf("\n");

	printf("DvxIx:   ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", dvx_ix[i]);
	}
	printf("\n");

	printf("BcIx:    ");
	for (int i = 0; i < numRow; i++) {
		printf(" %4d", model->getBaseIndex()[i]);
	}
	printf("\n");

	printf("DvxV:    ");
	for (int i = 0; i < numRow; i++) {
		printf(" %4.1g", dualRHS.workEdWt[i]);
	}
	printf("\n");
}